

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preview.c
# Opt level: O0

exr_result_t exr_attr_preview_init(exr_context_t ctxt,exr_attr_preview_t *p,uint32_t w,uint32_t h)

{
  exr_result_t eVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  uint64_t bytes;
  exr_attr_preview_t nil;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  uint local_20;
  uint local_1c;
  uint *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_38,0,0x18);
  uVar2 = (ulong)local_1c * (ulong)local_20 * 4;
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (uVar2 < 0x80000000) {
    if (local_18 == (uint *)0x0) {
      local_4 = (**(code **)(local_10 + 0x40))
                          (local_10,3,"Invalid reference to preview object to initialize");
    }
    else {
      *(undefined8 *)local_18 = local_38;
      *(undefined8 *)(local_18 + 2) = local_30;
      *(undefined8 *)(local_18 + 4) = local_28;
      if (uVar2 != 0) {
        uVar3 = (**(code **)(local_10 + 0x58))(uVar2);
        *(undefined8 *)(local_18 + 4) = uVar3;
        if (*(long *)(local_18 + 4) == 0) {
          eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
          return eVar1;
        }
        *(ulong *)(local_18 + 2) = uVar2;
        *local_18 = local_1c;
        local_18[1] = local_20;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,
                         "Invalid very large size for preview image (%u x %u - %lu bytes)",local_1c,
                         local_20,uVar2);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_preview_init (
    exr_context_t ctxt, exr_attr_preview_t* p, uint32_t w, uint32_t h)
{
    exr_attr_preview_t nil   = {0};
    uint64_t           bytes = (uint64_t) w * (uint64_t) h * (uint64_t) 4;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (bytes > (size_t) INT32_MAX)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid very large size for preview image (%u x %u - %" PRIu64
            " bytes)",
            w,
            h,
            (uint64_t) bytes);

    if (!p)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to preview object to initialize");

    *p = nil;
    if (bytes > 0)
    {
        p->rgba = (uint8_t*) ctxt->alloc_fn (bytes);
        if (p->rgba == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        p->alloc_size = bytes;
        p->width      = w;
        p->height     = h;
    }
    return EXR_ERR_SUCCESS;
}